

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O1

FILE * phosg::fdopen_binary_raw(int fd,string *mode)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  void *pvVar3;
  FILE *pFVar4;
  cannot_open_file *this;
  string new_mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar1 = (mode->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + mode->_M_string_length);
  _Var2._M_p = local_38._M_dataplus._M_p;
  if (local_38._M_string_length != 0) {
    pvVar3 = memchr(local_38._M_dataplus._M_p,0x62,local_38._M_string_length);
    if (pvVar3 != (void *)0x0 && (long)pvVar3 - (long)_Var2._M_p != -1) goto LAB_00111e6e;
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_38,'b');
LAB_00111e6e:
  pFVar4 = fdopen(fd,local_38._M_dataplus._M_p);
  if (pFVar4 != (FILE *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return (FILE *)pFVar4;
  }
  this = (cannot_open_file *)__cxa_allocate_exception(0x20);
  cannot_open_file::cannot_open_file(this,fd);
  __cxa_throw(this,&cannot_open_file::typeinfo,cannot_open_file::~cannot_open_file);
}

Assistant:

static FILE* fdopen_binary_raw(int fd, const string& mode) {
  string new_mode = mode;
  if (new_mode.find('b') == string::npos) {
    new_mode += 'b';
  }
  FILE* f = fdopen(fd, new_mode.c_str());
  if (!f) {
    throw cannot_open_file(fd);
  }
  return f;
}